

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::OSDText(OSDText *this)

{
  FT_Library *ppFVar1;
  FT_Face_conflict *ppFVar2;
  vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> local_38;
  OSDText *local_10;
  OSDText *this_local;
  
  local_10 = this;
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::vector(&this->lines);
  this->use_hdpi = false;
  ppFVar1 = (FT_Library *)operator_new(8);
  this->ft = ppFVar1;
  ppFVar2 = (FT_Face_conflict *)operator_new(8);
  this->face = ppFVar2;
  memset(&local_38,0,0x18);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::vector(&local_38);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::operator=(&this->lines,&local_38);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::~vector(&local_38);
  this->next_id = 0;
  return;
}

Assistant:

OSDText::OSDText() {

  use_hdpi = false;

  ft   = new FT_Library;
  face = new FT_Face;

  lines = vector<OSDLine>(); next_id = 0;
}